

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O0

int gc_state(lua_State *L)

{
  uint uVar1;
  global_State *pgVar2;
  int iVar3;
  global_State *g;
  int option;
  lua_State *L_local;
  
  iVar3 = luaL_checkoption(L,1,"",gc_state::statenames);
  uVar1 = gc_state::states[iVar3];
  if (uVar1 == 0xffffffff) {
    lua_pushstring(L,gc_state::statenames[L->l_G->gcstate]);
    L_local._4_4_ = 1;
  }
  else {
    pgVar2 = L->l_G;
    if (L->l_G->gckind == '\x01') {
      luaL_error(L,"cannot change states in generational mode");
    }
    iVar3 = **(int **)&L[-1].hookmask;
    **(int **)&L[-1].hookmask = iVar3 + 1;
    if (iVar3 != 0) {
      __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                    ,0x319,"int gc_state(lua_State *)");
    }
    if ((int)uVar1 < (int)(uint)pgVar2->gcstate) {
      luaC_runtilstate(L,0x100);
    }
    luaC_runtilstate(L,1 << ((byte)uVar1 & 0x1f));
    if (L->l_G->gcstate != uVar1) {
      __assert_fail("(L->l_G)->gcstate == option",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                    ,0x31e,"int gc_state(lua_State *)");
    }
    iVar3 = **(int **)&L[-1].hookmask + -1;
    **(int **)&L[-1].hookmask = iVar3;
    if (iVar3 != 0) {
      __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                    ,799,"int gc_state(lua_State *)");
    }
    L_local._4_4_ = 0;
  }
  return L_local._4_4_;
}

Assistant:

static int gc_state (lua_State *L) {
  static const char *statenames[] = {
    "propagate", "atomic", "enteratomic", "sweepallgc", "sweepfinobj",
    "sweeptobefnz", "sweepend", "callfin", "pause", ""};
  static const int states[] = {
    GCSpropagate, GCSenteratomic, GCSatomic, GCSswpallgc, GCSswpfinobj,
    GCSswptobefnz, GCSswpend, GCScallfin, GCSpause, -1};
  int option = states[luaL_checkoption(L, 1, "", statenames)];
  if (option == -1) {
    lua_pushstring(L, statenames[G(L)->gcstate]);
    return 1;
  }
  else {
    global_State *g = G(L);
    if (G(L)->gckind == KGC_GEN)
      luaL_error(L, "cannot change states in generational mode");
    lua_lock(L);
    if (option < g->gcstate) {  /* must cross 'pause'? */
      luaC_runtilstate(L, bitmask(GCSpause));  /* run until pause */
    }
    luaC_runtilstate(L, bitmask(option));
    lua_assert(G(L)->gcstate == option);
    lua_unlock(L);
    return 0;
  }
}